

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_PageHandle.cc
# Opt level: O1

void * __thiscall MyDB_PageHandleBase::getBytes(MyDB_PageHandleBase *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  MyDB_PageBase *pMVar1;
  MyDB_BufferManager *pMVar2;
  MyDB_LRU *pMVar3;
  element_type *peVar4;
  void *pvVar5;
  MyDB_TablePtr local_70;
  pair<std::shared_ptr<MyDB_Table>,_long> local_60;
  pair<std::shared_ptr<MyDB_Table>,_long> local_48;
  pair<std::shared_ptr<MyDB_Table>,_long> local_30;
  
  this_00 = (this->pagePtr->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pMVar1 = this->pagePtr;
  pMVar2 = this->bufferManager;
  if (pMVar1->addr == (void *)0x0) {
    pMVar3 = pMVar2->LRU;
    peVar4 = (pMVar1->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((pMVar2->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        (pMVar2->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pMVar1->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_48.second = (pMVar1->pageId).second;
      local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
      pvVar5 = MyDB_LRU::evictAndReplace(pMVar3,&local_48,this->pagePtr);
      if (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pMVar1->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_60.second = (pMVar1->pageId).second;
      local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
      MyDB_LRU::add(pMVar3,&local_60,this->pagePtr);
      if (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pvVar5 = *(this->bufferManager->availPageQueue).c.
                super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.super__Deque_impl_data.
                _M_start._M_cur;
      std::deque<void_*,_std::allocator<void_*>_>::pop_front
                (&(this->bufferManager->availPageQueue).c);
    }
    pMVar1 = this->pagePtr;
    pMVar1->addr = pvVar5;
    local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pMVar1->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (pMVar1->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    MyDB_PageBase::readFromDisk(pMVar1,&local_70,(this->pagePtr->pageId).second,this->pagePtr->addr)
    ;
    if (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    pMVar3 = pMVar2->LRU;
    local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pMVar1->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (pMVar1->pageId).first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    local_30.second = (pMVar1->pageId).second;
    MyDB_LRU::adjust(pMVar3,&local_30);
    if (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.first.super___shared_ptr<MyDB_Table,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pvVar5 = this->pagePtr->addr;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return pvVar5;
}

Assistant:

void *MyDB_PageHandleBase :: getBytes () {
	//store the spare address in the buffer that we will return
	void* spareAddr;
	pair<MyDB_TablePtr, long> curId = this->pagePtr->pageId;

	//map<pair<MyDB_TablePtr, long>, MyDB_Page>::iterator it_pageMap = this->bufferManager->pageMap.find(curId);
	//If find this page in buffer
	if (this->pagePtr->addr != nullptr) {
		this -> bufferManager -> LRU -> adjust(this -> pagePtr -> pageId);
		spareAddr = this->pagePtr->addr;

	}

	//If this page is in the disk and we need to read from disk and put it in the buffer
	else {
		//If there is no empty space in the buffer
		if (this->bufferManager->availPageQueue.empty()) {
			spareAddr = this -> bufferManager -> LRU -> evictAndReplace(this -> pagePtr -> pageId, this -> pagePtr);
		}
		else {
			this -> bufferManager -> LRU -> add(this -> pagePtr -> pageId, this -> pagePtr);
			spareAddr = this -> bufferManager -> availPageQueue.front();
			this -> bufferManager -> availPageQueue.pop();
		}
		this -> pagePtr -> addr = spareAddr;
		this -> pagePtr -> readFromDisk(this -> pagePtr -> pageId.first, this -> pagePtr -> pageId.second, this -> pagePtr ->addr);
	}

	return spareAddr;
}